

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O0

bool __thiscall
ON_LocalZero1::BracketZero(ON_LocalZero1 *this,double s0,double f0,double s1,double f1,int level)

{
  bool bVar1;
  uint uVar2;
  double local_58;
  double d;
  double f;
  double s;
  double dStack_38;
  int level_local;
  double f1_local;
  double s1_local;
  double f0_local;
  double s0_local;
  ON_LocalZero1 *this_local;
  
  if ((((f0 <= 0.0) && (0.0 <= f1)) || ((0.0 <= f0 && (f1 <= 0.0)))) ||
     ((ABS(f0) <= this->m_f_tolerance || (ABS(f1) <= this->m_f_tolerance)))) {
    this->m_t0 = s0;
    this->m_t1 = s1;
    return true;
  }
  s._4_4_ = level + 1;
  if ((((level < 9) && (f = s0 * 0.5 + s1, s0 < f)) && (f < s1)) &&
     (dStack_38 = f1, f1_local = s1, s1_local = f0, f0_local = s0, s0_local = (double)this,
     uVar2 = (*this->_vptr_ON_LocalZero1[2])(SUB84(f,0),this,&d,&local_58,0), (uVar2 & 1) != 0)) {
    if (d * local_58 < 0.0) {
      bVar1 = BracketZero(this,f,d,f1_local,dStack_38,s._4_4_);
      if (bVar1) {
        this->m_s0 = f;
        this->m_f0 = d;
        this->m_s1 = f1_local;
        this->m_f1 = dStack_38;
        return true;
      }
      bVar1 = BracketZero(this,f0_local,s1_local,f,d,s._4_4_);
      if (bVar1) {
        this->m_s0 = f0_local;
        this->m_f0 = s1_local;
        this->m_s1 = f;
        this->m_f1 = d;
        return true;
      }
    }
    else {
      bVar1 = BracketZero(this,f0_local,s1_local,f,d,s._4_4_);
      if (bVar1) {
        this->m_s0 = f0_local;
        this->m_f0 = s1_local;
        this->m_s1 = f;
        this->m_f1 = d;
        return true;
      }
      bVar1 = BracketZero(this,f,d,f1_local,dStack_38,s._4_4_);
      if (bVar1) {
        this->m_s0 = f;
        this->m_f0 = d;
        this->m_s1 = f1_local;
        this->m_f1 = dStack_38;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
ON_LocalZero1::BracketZero( double s0, double f0, 
                             double s1, double f1,
                             int level )
{
  double s, f, d;

  // private helper for FindSearchDomain()
  if (    (f0 <= 0.0 && f1 >= 0.0) || (f0 >= 0.0 && f1 <= 0.0)
       || fabs(f0) <= m_f_tolerance || fabs(f1) <= m_f_tolerance ) {
    m_t0 = s0;
    m_t1 = s1;
    return true;
  }

  if ( level++ <= 8 ) {
    s = 0.5*s0+s1;
    if ( s0 < s && s < s1 && Evaluate(s,&f,&d,0) ) {
      if ( f*d >= 0.0 ) {
        // search left side first
        if ( BracketZero(s0,f0,s,f,level ) ) {
          m_s0 = s0;
          m_f0 = f0;
          m_s1 = s;
          m_f1 = f;
          return true;
        }
        if ( BracketZero(s,f,s1,f1,level ) ) {
          m_s0 = s;
          m_f0 = f;
          m_s1 = s1;
          m_f1 = f1;
          return true;
        }
      }
      else {
        // search right side first
        if ( BracketZero(s,f,s1,f1,level ) ) {
          m_s0 = s;
          m_f0 = f;
          m_s1 = s1;
          m_f1 = f1;
          return true;
        }
        if ( BracketZero(s0,f0,s,f,level ) ) {
          m_s0 = s0;
          m_f0 = f0;
          m_s1 = s;
          m_f1 = f;
          return true;
        }
      }
    }
  }
  return false;
}